

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

shared_ptr<Type> __thiscall SetElem::check(SetElem *this,shared_ptr<Type> *p1,shared_ptr<Type> *p2)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<Type> sVar4;
  bool local_a1;
  long local_a0;
  Array *local_90;
  shared_ptr<Type> local_58;
  shared_ptr<Type> local_48;
  long local_38;
  Array *arr_right;
  Array *arr_left;
  shared_ptr<Type> *p2_local;
  shared_ptr<Type> *p1_local;
  SetElem *this_local;
  
  p2_local = p2;
  p1_local = p1;
  this_local = this;
  peVar2 = std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::get
                     (&p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar2 == (element_type *)0x0) {
    local_90 = (Array *)0x0;
  }
  else {
    local_90 = (Array *)__dynamic_cast(peVar2,&Type::typeinfo,&Array::typeinfo,0);
  }
  arr_right = local_90;
  peVar2 = std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::get(in_RCX);
  if (peVar2 == (element_type *)0x0) {
    local_a0 = 0;
  }
  else {
    local_a0 = __dynamic_cast(peVar2,&Type::typeinfo,&Array::typeinfo,0);
  }
  local_38 = local_a0;
  if ((arr_right == (Array *)0x0) && (local_a0 == 0)) {
    bVar1 = std::operator==(p2,(shared_ptr<Type> *)in_RCX);
    if (bVar1) {
      std::shared_ptr<Type>::shared_ptr((shared_ptr<Type> *)this,(shared_ptr<Type> *)in_RCX);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      std::shared_ptr<Type>::shared_ptr(&local_48,p2);
      bVar1 = Type::numeric(&local_48);
      local_a1 = false;
      if (bVar1) {
        std::shared_ptr<Type>::shared_ptr(&local_58,(shared_ptr<Type> *)in_RCX);
        local_a1 = Type::numeric(&local_58);
        std::shared_ptr<Type>::~shared_ptr(&local_58);
      }
      std::shared_ptr<Type>::~shared_ptr(&local_48);
      if (local_a1 == false) {
        std::shared_ptr<Type>::shared_ptr((shared_ptr<Type> *)this,(nullptr_t)0x0);
        _Var3._M_pi = extraout_RDX_02;
      }
      else {
        std::shared_ptr<Type>::shared_ptr((shared_ptr<Type> *)this,(shared_ptr<Type> *)in_RCX);
        _Var3._M_pi = extraout_RDX_01;
      }
    }
  }
  else {
    std::shared_ptr<Type>::shared_ptr((shared_ptr<Type> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Type>)sVar4.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Type> check(std::shared_ptr<Type> p1, std::shared_ptr<Type> p2) {
		Array* arr_left = dynamic_cast<Array*>(p1.get());
		Array* arr_right = dynamic_cast<Array*>(p2.get());
		if (arr_left || arr_right) return nullptr;
		else if (p1 == p2) return p2;
		else if (Type::numeric(p1) && Type::numeric(p2)) return p2;
		else return nullptr;
	}